

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

double nk_propertyd(nk_context *ctx,char *name,double min,double val,double max,double step,
                   float inc_per_pixel)

{
  nk_property_variant local_98;
  undefined1 local_70 [8];
  nk_property_variant variant;
  float inc_per_pixel_local;
  double step_local;
  double max_local;
  double val_local;
  double min_local;
  char *name_local;
  nk_context *ctx_local;
  
  variant.step._4_4_ = inc_per_pixel;
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4de8,
                  "double nk_propertyd(struct nk_context *, const char *, double, double, double, double, float)"
                 );
  }
  if (name == (char *)0x0) {
    __assert_fail("name",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4de9,
                  "double nk_propertyd(struct nk_context *, const char *, double, double, double, double, float)"
                 );
  }
  ctx_local = (nk_context *)val;
  if (((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) && (name != (char *)0x0)) {
    nk_property_variant_double(&local_98,val,min,max,step);
    memcpy(local_70,&local_98,0x28);
    nk_property(ctx,name,(nk_property_variant *)local_70,(float)variant.step._4_4_,NK_FILTER_FLOAT);
    ctx_local = (nk_context *)variant._0_8_;
  }
  return (double)ctx_local;
}

Assistant:

NK_API double
nk_propertyd(struct nk_context *ctx, const char *name, double min,
    double val, double max, double step, float inc_per_pixel)
{
    struct nk_property_variant variant;
    NK_ASSERT(ctx);
    NK_ASSERT(name);

    if (!ctx || !ctx->current || !name) return val;
    variant = nk_property_variant_double(val, min, max, step);
    nk_property(ctx, name, &variant, inc_per_pixel, NK_FILTER_FLOAT);
    val = variant.value.d;
    return val;
}